

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL Js::JavascriptArray::GetIndex(char16 *propName,uint32 *pIndex)

{
  char16 cVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  char16 *pcVar5;
  uint uVar6;
  
  sVar3 = PAL_wcslen(propName);
  uVar4 = (ushort)*propName - 0x30;
  uVar2 = 0;
  if (uVar4 < 10) {
    if (uVar4 == 0) {
      *pIndex = 0;
      uVar2 = (uint)((int)sVar3 == 1);
    }
    else {
      pcVar5 = propName + 1;
      cVar1 = propName[1];
      while( true ) {
        uVar6 = (ushort)cVar1 - 0x30;
        if (9 < uVar6) break;
        if (0x19999999 < uVar4) {
          return 0;
        }
        if (0x2f - (ushort)cVar1 < uVar4 * 10) {
          return 0;
        }
        uVar4 = uVar6 + uVar4 * 10;
        cVar1 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      }
      if ((uVar4 != 0xffffffff) && ((long)pcVar5 - (long)propName >> 1 == (long)(int)sVar3)) {
        *pIndex = uVar4;
        uVar2 = 1;
      }
    }
  }
  return uVar2;
}

Assistant:

BOOL JavascriptArray::GetIndex(const char16* propName, uint32 *pIndex)
    {
        uint32 lu, luDig;

        int32 cch = (int32)wcslen(propName);
        char16* pch = const_cast<char16 *>(propName);

        lu = *pch - '0';
        if (lu > 9)
            return FALSE;

        if (0 == lu)
        {
            *pIndex = 0;
            return 1 == cch;
        }

        while ((luDig = *++pch - '0') < 10)
        {
            // If we overflow 32 bits, ignore the item
            if (lu > 0x19999999)
                return FALSE;
            lu *= 10;
            if(lu > (ULONG_MAX - luDig))
                return FALSE;
            lu += luDig;
        }

        if (pch - propName != cch)
            return FALSE;

        if (lu == JavascriptArray::InvalidIndex)
        {
            // 0xFFFFFFFF is not treated as an array index so that the length can be
            // capped at 32 bits.
            return FALSE;
        }

        *pIndex = lu;
        return TRUE;
    }